

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclWriteScl(char *pFileName,SC_Lib *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  size_t __size;
  uint uVar6;
  Vec_Str_t *vOut;
  char *pcVar7;
  FILE *__s;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  vOut = (Vec_Str_t *)malloc(0x10);
  vOut->nCap = 10000;
  pcVar7 = (char *)malloc(10000);
  vOut->pArray = pcVar7;
  vOut->nSize = 1;
  *pcVar7 = '\b';
  Vec_StrPutS(vOut,p->pName);
  Vec_StrPutS(vOut,p->default_wire_load);
  Vec_StrPutS(vOut,p->default_wire_load_sel);
  Vec_StrPutF(vOut,p->default_max_out_slew);
  if (p->unit_time < 0) {
    __assert_fail("p->unit_time >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                  ,0x1f7,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  if (p->unit_cap_snd < 0) {
    __assert_fail("p->unit_cap_snd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                  ,0x1f8,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  Vec_StrPutI(vOut,p->unit_time);
  Vec_StrPutF(vOut,p->unit_cap_fst);
  Vec_StrPutI(vOut,p->unit_cap_snd);
  Vec_StrPutI(vOut,(p->vWireLoads).nSize);
  if (0 < (p->vWireLoads).nSize) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoads).pArray[lVar8];
      Vec_StrPutS(vOut,(char *)*puVar1);
      Vec_StrPutF(vOut,*(float *)(puVar1 + 1));
      Vec_StrPutF(vOut,*(float *)((long)puVar1 + 0xc));
      Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0x14));
      if (0 < *(int *)((long)puVar1 + 0x14)) {
        lVar13 = 0;
        do {
          Vec_StrPutI(vOut,*(int *)(puVar1[3] + lVar13 * 4));
          if (*(int *)((long)puVar1 + 0x24) <= lVar13) goto LAB_0046dd01;
          Vec_StrPutF(vOut,*(float *)(puVar1[5] + lVar13 * 4));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)puVar1 + 0x14));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vWireLoads).nSize);
  }
  Vec_StrPutI(vOut,(p->vWireLoadSels).nSize);
  if (0 < (p->vWireLoadSels).nSize) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoadSels).pArray[lVar8];
      Vec_StrPutS(vOut,(char *)*puVar1);
      Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0xc));
      if (0 < *(int *)((long)puVar1 + 0xc)) {
        lVar13 = 0;
        do {
          Vec_StrPutF(vOut,*(float *)(puVar1[2] + lVar13 * 4));
          if (*(int *)((long)puVar1 + 0x1c) <= lVar13) {
LAB_0046dd01:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          Vec_StrPutF(vOut,*(float *)(puVar1[4] + lVar13 * 4));
          if (*(int *)((long)puVar1 + 0x2c) <= lVar13) goto LAB_0046dd20;
          Vec_StrPutS(vOut,*(char **)(puVar1[6] + lVar13 * 8));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)puVar1 + 0xc));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vWireLoadSels).nSize);
  }
  lVar8 = (long)(p->vCells).nSize;
  if (lVar8 < 1) {
    iVar9 = 0;
  }
  else {
    lVar13 = 0;
    iVar9 = 0;
    do {
      pvVar2 = (p->vCells).pArray[lVar13];
      if (*(int *)((long)pvVar2 + 0x10) == 0) {
        iVar9 = iVar9 + (uint)(*(int *)((long)pvVar2 + 0x14) == 0);
      }
      lVar13 = lVar13 + 1;
    } while (lVar8 != lVar13);
  }
  Vec_StrPutI(vOut,iVar9);
  if (0 < (p->vCells).nSize) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)(p->vCells).pArray[lVar8];
      if ((*(int *)(puVar1 + 2) == 0) && (*(int *)((long)puVar1 + 0x14) == 0)) {
        Vec_StrPutS(vOut,(char *)*puVar1);
        Vec_StrPutF(vOut,*(float *)(puVar1 + 3));
        Vec_StrPutF(vOut,*(float *)((long)puVar1 + 0x1c));
        Vec_StrPutI(vOut,*(int *)(puVar1 + 5));
        Vec_StrPutI(vOut,*(int *)(puVar1 + 8));
        Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0x44));
        uVar6 = *(uint *)(puVar1 + 8);
        if (0 < (int)uVar6) {
          lVar13 = 0;
          do {
            if (*(int *)((long)puVar1 + 0x34) <= lVar13) goto LAB_0046dd20;
            puVar3 = *(undefined8 **)(puVar1[7] + lVar13 * 8);
            if (*(int *)(puVar3 + 1) != 1) {
              __assert_fail("pPin->dir == sc_dir_Input",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                            ,0x232,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            Vec_StrPutS(vOut,(char *)*puVar3);
            Vec_StrPutF(vOut,*(float *)(puVar3 + 2));
            Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0x14));
            lVar13 = lVar13 + 1;
            uVar6 = *(uint *)(puVar1 + 8);
          } while (lVar13 < (int)uVar6);
        }
        if ((int)uVar6 < *(int *)((long)puVar1 + 0x34)) {
          if ((int)uVar6 < 0) {
LAB_0046dd20:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar12 = (ulong)uVar6;
          do {
            puVar3 = *(undefined8 **)(puVar1[7] + uVar12 * 8);
            if (*(int *)(puVar3 + 1) != 2) {
              __assert_fail("pPin->dir == sc_dir_Output",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                            ,0x23d,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            Vec_StrPutS(vOut,(char *)*puVar3);
            Vec_StrPutF(vOut,*(float *)(puVar3 + 4));
            Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0x24));
            Vec_StrPutI(vOut,*(int *)(puVar1 + 8));
            pcVar7 = (char *)puVar3[5];
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "";
            }
            Vec_StrPutS(vOut,pcVar7);
            iVar9 = *(int *)(puVar1 + 8);
            iVar10 = 1 << ((char)iVar9 - 6U & 0x1f);
            if (iVar9 < 7) {
              iVar10 = 1;
            }
            if (*(int *)((long)puVar3 + 0x34) != iVar10) {
              __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                            ,0x247,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            if (0 < *(int *)((long)puVar3 + 0x34)) {
              lVar13 = 0;
              do {
                uVar4 = *(ulong *)(puVar3[7] + lVar13 * 8);
                lVar11 = 0;
                do {
                  uVar6 = vOut->nSize;
                  if (uVar6 == vOut->nCap) {
                    if ((int)uVar6 < 0x10) {
                      if (vOut->pArray == (char *)0x0) {
                        pcVar7 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar7 = (char *)realloc(vOut->pArray,0x10);
                      }
                      vOut->pArray = pcVar7;
                      vOut->nCap = 0x10;
                    }
                    else {
                      __size = (ulong)uVar6 * 2;
                      if (vOut->pArray == (char *)0x0) {
                        pcVar7 = (char *)malloc(__size);
                      }
                      else {
                        pcVar7 = (char *)realloc(vOut->pArray,__size);
                      }
                      vOut->pArray = pcVar7;
                      vOut->nCap = (int)__size;
                    }
                  }
                  else {
                    pcVar7 = vOut->pArray;
                  }
                  vOut->nSize = uVar6 + 1;
                  pcVar7[(int)uVar6] = (char)(uVar4 >> ((byte)lVar11 & 0x3f));
                  lVar11 = lVar11 + 8;
                } while (lVar11 != 0x40);
                lVar13 = lVar13 + 1;
              } while (lVar13 < *(int *)((long)puVar3 + 0x34));
              iVar9 = *(int *)(puVar1 + 8);
            }
            if (*(int *)((long)puVar3 + 0x44) != iVar9) {
              __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                            ,0x24c,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            if (0 < iVar9) {
              lVar13 = 0;
              do {
                puVar5 = *(undefined8 **)(puVar3[9] + lVar13 * 8);
                Vec_StrPutS(vOut,(char *)*puVar5);
                Vec_StrPutI(vOut,*(int *)((long)puVar5 + 0xc));
                if (*(int *)((long)puVar5 + 0xc) != 0) {
                  if (*(int *)((long)puVar5 + 0xc) != 1) {
                    __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                                  ,0x260,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
                  }
                  lVar11 = *(long *)puVar5[2];
                  Vec_StrPutI(vOut,*(int *)(lVar11 + 8));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar11 + 0x18));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar11 + 200));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar11 + 0x178));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar11 + 0x228));
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < *(int *)((long)puVar3 + 0x44));
            }
            uVar12 = uVar12 + 1;
          } while ((int)uVar12 < *(int *)((long)puVar1 + 0x34));
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vCells).nSize);
  }
  iVar9 = vOut->nSize;
  if (0 < (long)iVar9) {
    __s = fopen(pFileName,"wb");
    if (__s != (FILE *)0x0) {
      pcVar7 = vOut->pArray;
      fwrite(pcVar7,1,(long)iVar9,__s);
      fclose(__s);
      goto LAB_0046dcdc;
    }
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  pcVar7 = vOut->pArray;
LAB_0046dcdc:
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
  }
  free(vOut);
  return;
}

Assistant:

void Abc_SclWriteScl( char * pFileName, SC_Lib * p )
{
    Vec_Str_t * vOut;
    vOut = Vec_StrAlloc( 10000 );
    Abc_SclWriteLibrary( vOut, p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFree( vOut );    
}